

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

bool tchecker::ta::has_non_constant_reset(system_t *system)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  has_clock_resets_t hVar2;
  const_iterator cVar3;
  typed_statement_t *stmt;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar4;
  
  rVar4 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  cVar3._M_current =
       (shared_ptr<tchecker::system::edge_t> *)rVar4._begin.super_const_iterator._M_current;
  while( true ) {
    if ((const_iterator)cVar3._M_current ==
        rVar4._end.super_const_iterator._M_current.super_const_iterator) {
      return false;
    }
    peVar1 = ((cVar3._M_current)->
             super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this = ((cVar3._M_current)->
           super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    stmt = system_t::statement(system,peVar1->_id);
    hVar2 = has_clock_resets(stmt);
    if (((uint3)hVar2 & 0x10100) != 0) break;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    cVar3._M_current = cVar3._M_current + 1;
  }
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return true;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return true;
}

Assistant:

bool has_non_constant_reset(tchecker::ta::system_t const & system)
{
  // Check edge statements
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_resets_t statement_has_clock_resets = tchecker::has_clock_resets(system.statement(edge->id()));
    if (statement_has_clock_resets.clock || statement_has_clock_resets.sum)
      return true;
  }
  return false;
}